

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
          (HeapBlockMap32 *this,SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlock,
          char *pageAddress,HeapBlockType blockType,uint bucketIndex,L2MapChunk *chunk,
          Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint localObjectSize;
  undefined4 *puVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  BVStatic<2048UL> *local_40;
  
  if (heapBlock == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46d,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar2) goto LAB_006c1c37;
    *puVar6 = 0;
  }
  if ((heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).super_HeapBlock.
      heapBlockType != blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46e,"(heapBlock->GetHeapBlockType() == blockType)",
                       "heapBlock->GetHeapBlockType() == blockType");
    if (!bVar2) goto LAB_006c1c37;
    *puVar6 = 0;
  }
  pcVar7 = (heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).super_HeapBlock.
           address;
  if (this->map[(ulong)pcVar7 >> 0x14 & 0xfff] == (L2MapChunk *)0x0) {
    local_40 = (BVStatic<2048UL> *)0x0;
  }
  else {
    local_40 = BVStatic<65536ul>::GetRange<2048ul>
                         ((BVStatic<65536ul> *)this->map[(ulong)pcVar7 >> 0x14 & 0xfff],
                          (uint)pcVar7 >> 4 & 0xff00);
  }
  pcVar7 = (char *)((ulong)pageAddress & 0xffffffffffff8000);
  if (pcVar7 != pageAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x474,"(blockStartAddress == pageAddress)",
                       "blockStartAddress == pageAddress");
    if (!bVar2) {
LAB_006c1c37:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetPageCount
                    (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
  uVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetUnusablePageCount
                    (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
  uVar8 = uVar4 - uVar5;
  bVar2 = (int)uVar8 < 1;
  if (0 < (int)uVar8) {
    localObjectSize = bucketIndex * 0x100 + 0x400;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar9 = 0;
    do {
      if (0x1cff < (ulong)localObjectSize - 0x301) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                           ,0x2ef,
                           "(IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity)))"
                           ,
                           "IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity))"
                          );
        if (!bVar3) goto LAB_006c1c37;
        *puVar6 = 0;
      }
      bVar3 = SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
              ::RescanObjectsOnPage
                        (heapBlock,pcVar7 + (uint)((int)uVar9 << 0xc),pcVar7,local_40,
                         localObjectSize,bucketIndex,(bool *)0x0,recycler);
      if (!bVar3) {
        HeapBlock::SetNeedOOMRescan((HeapBlock *)heapBlock,recycler);
      }
      bVar3 = Recycler::NeedOOMRescan(recycler);
      if (bVar3) {
        return bVar2;
      }
      uVar9 = uVar9 + 1;
      bVar2 = uVar8 <= uVar9;
    } while (uVar9 != uVar8);
  }
  this->anyHeapBlockRescannedDuringOOM = true;
  return bVar2;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlockOnOOM(TBlockType* heapBlock, char* pageAddress, HeapBlock::HeapBlockType blockType, uint bucketIndex, L2MapChunk * chunk, Recycler * recycler)
{
    // In the OOM codepath, we expect the heap block to be dereferenced since perf is not critical
    Assert(heapBlock != nullptr);
    Assert(heapBlock->GetHeapBlockType() == blockType);
    auto markBits = this->GetMarkBitVectorForPages<TBlockType::HeapBlockAttributes::BitVectorCount>(heapBlock->GetAddress());
    char* blockStartAddress = TBlockType::GetBlockStartAddress(pageAddress);

    // Rescan all pages in this block
    // The following assert makes sure that this method is called only once per heap block
    Assert(blockStartAddress == pageAddress);

    int inUsePageCount = heapBlock->GetPageCount() - heapBlock->GetUnusablePageCount();
    for (int i = 0; i < inUsePageCount; i++)
    {
        char* pageAddressToScan = blockStartAddress + (i * AutoSystemInfo::PageSize);

        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(heapBlock,
            pageAddressToScan, blockStartAddress, markBits, HeapInfo::template GetObjectSizeForBucketIndex<typename TBlockType::HeapBlockAttributes>(bucketIndex), bucketIndex, nullptr, recycler))
        {
            // Failed due to OOM
            ((TBlockType*)heapBlock)->SetNeedOOMRescan(recycler);
        }

        if (recycler->NeedOOMRescan())
        {
            // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
            return false;
        }
    }

    this->anyHeapBlockRescannedDuringOOM = true;

    return true;
}